

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_test.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::AnyTest_TestUnpackWithTypeMismatch_Test::TestBody
          (AnyTest_TestUnpackWithTypeMismatch_Test *this)

{
  bool bVar1;
  char *in_R9;
  AssertHelper local_400;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_3f8;
  string local_3f0;
  AssertionResult gtest_ar_;
  Any any;
  TestAny payload;
  TestAllTypes dest;
  
  proto2_unittest::TestAny::TestAny(&payload);
  payload.field_0._impl_.int32_value_ = 0xd;
  payload.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       payload.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 4;
  Any::Any(&any);
  Any::PackFrom(&any,&payload.super_Message);
  proto2_unittest::TestAllTypes::TestAllTypes(&dest);
  bVar1 = Any::UnpackTo(&any,&dest.super_Message);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_3f0,(internal *)&gtest_ar_,(AssertionResult *)"any.UnpackTo(&dest)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_400,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/any_test.cc"
               ,0x3d,local_3f0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_400,(Message *)&local_3f8);
    testing::internal::AssertHelper::~AssertHelper(&local_400);
    std::__cxx11::string::~string((string *)&local_3f0);
    if (local_3f8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_3f8._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  proto2_unittest::TestAllTypes::~TestAllTypes(&dest);
  Any::~Any(&any);
  proto2_unittest::TestAny::~TestAny(&payload);
  return;
}

Assistant:

TEST(AnyTest, TestUnpackWithTypeMismatch) {
  proto2_unittest::TestAny payload;
  payload.set_int32_value(13);
  google::protobuf::Any any;
  any.PackFrom(payload);

  // Attempt to unpack into the wrong type.
  proto2_unittest::TestAllTypes dest;
  EXPECT_FALSE(any.UnpackTo(&dest));
}